

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::GenerateSource
          (EnumGenerator *this,Printer *printer)

{
  string *value;
  pointer ppEVar1;
  bool bVar2;
  EnumValueDescriptor *extraout_RDX;
  string *name;
  EnumValueDescriptor *extraout_RDX_00;
  EnumValueDescriptor *extraout_RDX_01;
  EnumValueDescriptor *extraout_RDX_02;
  EnumValueDescriptor *extraout_RDX_03;
  EnumValueDescriptor *pEVar3;
  EnumValueDescriptor *extraout_RDX_04;
  int i;
  ulong uVar4;
  string short_name;
  TextFormatDecodeData text_format_decode_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string text_blob;
  string local_50;
  
  value = &this->name_;
  io::Printer::Print(printer,"#pragma mark - Enum $name$\n\n","name",value);
  TextFormatDecodeData::TextFormatDecodeData(&text_format_decode_data);
  text_blob._M_dataplus._M_p = (pointer)&text_blob.field_2;
  text_blob._M_string_length = 0;
  text_blob.field_2._M_local_buf[0] = '\0';
  pEVar3 = extraout_RDX;
  for (uVar4 = 0;
      ppEVar1 = (this->all_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->all_values_).
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3);
      uVar4 = uVar4 + 1) {
    EnumValueShortName_abi_cxx11_(&short_name,(objectivec *)ppEVar1[uVar4],pEVar3);
    std::operator+(&local_90,&short_name,'\0');
    std::__cxx11::string::append((string *)&text_blob);
    std::__cxx11::string::~string((string *)&local_90);
    UnCamelCaseEnumShortName(&local_90,(objectivec *)&short_name,name);
    bVar2 = std::operator!=(&local_90,
                            *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             (this->all_values_).
                             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4]);
    std::__cxx11::string::~string((string *)&local_90);
    if (bVar2) {
      TextFormatDecodeData::AddString
                (&text_format_decode_data,(int32)uVar4,&short_name,
                 *(string **)
                  (this->all_values_).
                  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar4]);
    }
    std::__cxx11::string::~string((string *)&short_name);
    pEVar3 = extraout_RDX_00;
  }
  io::Printer::Print(printer,
                     "GPBEnumDescriptor *$name$_EnumDescriptor(void) {\n  static GPBEnumDescriptor *descriptor = NULL;\n  if (!descriptor) {\n"
                     ,"name",value);
  io::Printer::Print(printer,"    static const char *valueNames =");
  for (uVar4 = 0; uVar4 < text_blob._M_string_length; uVar4 = uVar4 + 0x28) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&text_blob);
    CEscape(&local_90,&local_50);
    EscapeTrigraphs(&short_name,&local_90);
    io::Printer::Print(printer,"\n        \"$data$\"","data",&short_name);
    std::__cxx11::string::~string((string *)&short_name);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  io::Printer::Print(printer,";\n    static const int32_t values[] = {\n");
  pEVar3 = extraout_RDX_01;
  for (uVar4 = 0;
      ppEVar1 = (this->all_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->all_values_).
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3);
      uVar4 = uVar4 + 1) {
    EnumValueName_abi_cxx11_(&short_name,(objectivec *)ppEVar1[uVar4],pEVar3);
    io::Printer::Print(printer,"        $name$,\n","name",&short_name);
    std::__cxx11::string::~string((string *)&short_name);
    pEVar3 = extraout_RDX_02;
  }
  io::Printer::Print(printer,"    };\n");
  if (text_format_decode_data.entries_.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      text_format_decode_data.entries_.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    io::Printer::Print(printer,
                       "    GPBEnumDescriptor *worker =\n        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n                                       valueNames:valueNames\n                                           values:values\n                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n                                     enumVerifier:$name$_IsValidValue];\n"
                       ,"name",value);
  }
  else {
    TextFormatDecodeData::Data_abi_cxx11_(&local_90,&text_format_decode_data);
    CEscape(&short_name,&local_90);
    io::Printer::Print(printer,
                       "    static const char *extraTextFormatInfo = \"$extraTextFormatInfo$\";\n    GPBEnumDescriptor *worker =\n        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n                                       valueNames:valueNames\n                                           values:values\n                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n                                     enumVerifier:$name$_IsValidValue\n                              extraTextFormatInfo:extraTextFormatInfo];\n"
                       ,"name",value,"extraTextFormatInfo",&short_name);
    std::__cxx11::string::~string((string *)&short_name);
    std::__cxx11::string::~string((string *)&local_90);
  }
  io::Printer::Print(printer,
                     "    if (!OSAtomicCompareAndSwapPtrBarrier(nil, worker, (void * volatile *)&descriptor)) {\n      [worker release];\n    }\n  }\n  return descriptor;\n}\n\n"
                    );
  io::Printer::Print(printer,"BOOL $name$_IsValidValue(int32_t value__) {\n  switch (value__) {\n",
                     "name",value);
  pEVar3 = extraout_RDX_03;
  for (uVar4 = 0;
      ppEVar1 = (this->base_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->base_values_).
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3);
      uVar4 = uVar4 + 1) {
    EnumValueName_abi_cxx11_(&short_name,(objectivec *)ppEVar1[uVar4],pEVar3);
    io::Printer::Print(printer,"    case $name$:\n","name",&short_name);
    std::__cxx11::string::~string((string *)&short_name);
    pEVar3 = extraout_RDX_04;
  }
  io::Printer::Print(printer,"      return YES;\n    default:\n      return NO;\n  }\n}\n\n");
  std::__cxx11::string::~string((string *)&text_blob);
  TextFormatDecodeData::~TextFormatDecodeData(&text_format_decode_data);
  return;
}

Assistant:

void EnumGenerator::GenerateSource(io::Printer* printer) {
  printer->Print(
      "#pragma mark - Enum $name$\n"
      "\n",
      "name", name_);

  // Note: For the TextFormat decode info, we can't use the enum value as
  // the key because protocol buffer enums have 'allow_alias', which lets
  // a value be used more than once. Instead, the index into the list of
  // enum value descriptions is used. Note: start with -1 so the first one
  // will be zero.
  TextFormatDecodeData text_format_decode_data;
  int enum_value_description_key = -1;
  string text_blob;

  for (int i = 0; i < all_values_.size(); i++) {
    ++enum_value_description_key;
    string short_name(EnumValueShortName(all_values_[i]));
    text_blob += short_name + '\0';
    if (UnCamelCaseEnumShortName(short_name) != all_values_[i]->name()) {
      text_format_decode_data.AddString(enum_value_description_key, short_name,
                                        all_values_[i]->name());
    }
  }

  printer->Print(
      "GPBEnumDescriptor *$name$_EnumDescriptor(void) {\n"
      "  static GPBEnumDescriptor *descriptor = NULL;\n"
      "  if (!descriptor) {\n",
      "name", name_);

  static const int kBytesPerLine = 40;  // allow for escaping
  printer->Print(
      "    static const char *valueNames =");
  for (int i = 0; i < text_blob.size(); i += kBytesPerLine) {
    printer->Print(
        "\n        \"$data$\"",
        "data", EscapeTrigraphs(CEscape(text_blob.substr(i, kBytesPerLine))));
  }
  printer->Print(
      ";\n"
      "    static const int32_t values[] = {\n");
  for (int i = 0; i < all_values_.size(); i++) {
    printer->Print("        $name$,\n",  "name", EnumValueName(all_values_[i]));
  }
  printer->Print("    };\n");

  if (text_format_decode_data.num_entries() == 0) {
    printer->Print(
        "    GPBEnumDescriptor *worker =\n"
        "        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n"
        "                                       valueNames:valueNames\n"
        "                                           values:values\n"
        "                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n"
        "                                     enumVerifier:$name$_IsValidValue];\n",
        "name", name_);
    } else {
      printer->Print(
        "    static const char *extraTextFormatInfo = \"$extraTextFormatInfo$\";\n"
        "    GPBEnumDescriptor *worker =\n"
        "        [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n"
        "                                       valueNames:valueNames\n"
        "                                           values:values\n"
        "                                            count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n"
        "                                     enumVerifier:$name$_IsValidValue\n"
        "                              extraTextFormatInfo:extraTextFormatInfo];\n",
        "name", name_,
        "extraTextFormatInfo", CEscape(text_format_decode_data.Data()));
    }
    printer->Print(
      "    if (!OSAtomicCompareAndSwapPtrBarrier(nil, worker, (void * volatile *)&descriptor)) {\n"
      "      [worker release];\n"
      "    }\n"
      "  }\n"
      "  return descriptor;\n"
      "}\n\n");

  printer->Print(
      "BOOL $name$_IsValidValue(int32_t value__) {\n"
      "  switch (value__) {\n",
      "name", name_);

  for (int i = 0; i < base_values_.size(); i++) {
    printer->Print(
        "    case $name$:\n",
        "name", EnumValueName(base_values_[i]));
  }

  printer->Print(
      "      return YES;\n"
      "    default:\n"
      "      return NO;\n"
      "  }\n"
      "}\n\n");
}